

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  Result RVar1;
  char *desc_local;
  TypeChecker *this_local;
  Type expected3_local;
  Type expected2_local;
  Type expected1_local;
  Result result;
  
  Result::Result((Result *)&expected2_local,Ok);
  RVar1 = PeekAndCheckType(this,0,expected3);
  Result::operator|=((Result *)&expected2_local,RVar1);
  RVar1 = PeekAndCheckType(this,1,expected2);
  Result::operator|=((Result *)&expected2_local,RVar1);
  RVar1 = PeekAndCheckType(this,2,expected1);
  Result::operator|=((Result *)&expected2_local,RVar1);
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,(Result)expected2_local.enum_,desc,expected1,expected2,expected3);
  RVar1 = DropTypes(this,3);
  Result::operator|=((Result *)&expected2_local,RVar1);
  return (Result)expected2_local.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}